

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::~jpeg_decoder(jpeg_decoder *this)

{
  jpeg_decoder *this_local;
  
  free_all_blocks(this);
  return;
}

Assistant:

jpeg_decoder::~jpeg_decoder()
{
  free_all_blocks();
}